

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void Plink_copy(plink **to,plink *from)

{
  plink *ppVar1;
  
  while (from != (plink *)0x0) {
    ppVar1 = from->next;
    from->next = *to;
    *to = from;
    from = ppVar1;
  }
  return;
}

Assistant:

void Plink_copy(struct plink **to, struct plink *from)
{
  struct plink *nextpl;
  while( from ){
    nextpl = from->next;
    from->next = *to;
    *to = from;
    from = nextpl;
  }
}